

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

void Extra_TruthCofactor1(uint *pTruth,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int local_24;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Extra_TruthWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                  ,0x194,"void Extra_TruthCofactor1(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = pTruth[Step] & 0xaaaaaaaa | (pTruth[Step] & 0xaaaaaaaa) >> 1;
    }
    break;
  case 1:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = pTruth[Step] & 0xcccccccc | (pTruth[Step] & 0xcccccccc) >> 2;
    }
    break;
  case 2:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = pTruth[Step] & 0xf0f0f0f0 | (pTruth[Step] & 0xf0f0f0f0) >> 4;
    }
    break;
  case 3:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = pTruth[Step] & 0xff00ff00 | (pTruth[Step] & 0xff00ff00) >> 8;
    }
    break;
  case 4:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pTruth[Step] = pTruth[Step] & 0xffff0000 | pTruth[Step] >> 0x10;
    }
    break;
  default:
    iVar2 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pTruth;
    for (local_24 = 0; local_24 < iVar1; local_24 = iVar2 * 2 + local_24) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        _iVar_local[Step] = _iVar_local[iVar2 + Step];
      }
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
  }
  return;
}

Assistant:

void Extra_TruthCofactor1( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xAAAAAAAA) | ((pTruth[i] & 0xAAAAAAAA) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xCCCCCCCC) | ((pTruth[i] & 0xCCCCCCCC) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xF0F0F0F0) | ((pTruth[i] & 0xF0F0F0F0) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xFF00FF00) | ((pTruth[i] & 0xFF00FF00) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xFFFF0000) | ((pTruth[i] & 0xFFFF0000) >> 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pTruth[i] = pTruth[Step+i];
            pTruth += 2*Step;
        }
        return;
    }
}